

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

buffer_appender<char>
fmt::v7::detail::write<char,fmt::v7::detail::buffer_appender<char>>
          (buffer_appender<char> out,char value)

{
  long lVar1;
  ulong uVar2;
  buffer<char> *buf;
  ulong uVar3;
  
  lVar1 = *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                   0x10);
  uVar2 = *(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                    + 0x18);
  uVar3 = lVar1 + 1;
  if (uVar2 < uVar3) {
    (*(code *)**(undefined8 **)
                out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
              (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
    lVar1 = *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                     + 0x10);
    uVar2 = *(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                             container + 0x18);
    uVar3 = lVar1 + 1;
  }
  if (uVar2 < uVar3) {
    (*(code *)**(undefined8 **)
                out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
              (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
    lVar1 = *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                     + 0x10);
    uVar3 = lVar1 + 1;
  }
  *(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 0x10)
       = uVar3;
  *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                     + 8) + lVar1) = value;
  return (buffer_appender<char>)
         out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
}

Assistant:

OutputIt write(OutputIt out, Char value) {
  auto it = reserve(out, 1);
  *it++ = value;
  return base_iterator(out, it);
}